

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::create_alpha_selector_codebook(dxt_hc *this)

{
  vector<unsigned_long_long> *this_00;
  int *piVar1;
  uint uVar2;
  alpha_selector_details *paVar3;
  uint s;
  unsigned_long_long *puVar4;
  byte bVar5;
  uint i;
  uint uVar6;
  long lVar7;
  uint c;
  uint uVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  uint8 p;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  void *pvVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  vector<crnlib::vector<crnlib::alpha_selector_details>_> selector_details;
  vector<unsigned_long_long> selectors;
  vector<unsigned_int> weights;
  uint weight;
  vector<crnlib::vec<16U,_float>_> vectors;
  vector<crnlib::SelectorNode> nodes;
  SelectorNode node;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  float v [8];
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  
  uVar2 = this->m_pTask_pool->m_num_threads;
  vector<unsigned_long_long>::vector
            (&selectors,
             (this->m_num_blocks >> (this->m_has_subblocks & 0x1fU)) * this->m_num_alpha_blocks);
  uVar6 = 0;
  for (uVar9 = 1; uVar9 < this->m_num_alpha_blocks + 1; uVar9 = uVar9 + 1) {
    bVar23 = this->m_has_subblocks;
    for (uVar17 = 0; (uint)uVar17 < this->m_num_blocks; uVar17 = (ulong)((uint)uVar17 + bVar23 + 1))
    {
      uVar13 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      selectors.m_p[uVar13] = this->m_block_selectors[uVar9].m_p[uVar17];
    }
  }
  uVar6 = uVar2 + 1;
  nodes.m_p = (SelectorNode *)0x0;
  nodes.m_size = 0;
  nodes.m_capacity = 0;
  node.p = (uint64 *)0x0;
  node.pEnd = selectors.m_p;
  for (iVar16 = 1; iVar16 - uVar2 != 2; iVar16 = iVar16 + 1) {
    node.p = node.pEnd;
    puVar4 = selectors.m_p + (ulong)(selectors.m_size * iVar16) / (ulong)uVar6;
    bVar23 = node.pEnd != puVar4;
    node.pEnd = puVar4;
    if (bVar23) {
      vector<crnlib::SelectorNode>::push_back(&nodes,&node);
    }
  }
  lVar15 = 0;
  for (uVar9 = 0; uVar9 < (nodes._8_8_ & 0xffffffff); uVar9 = uVar9 + 1) {
    task_pool::queue_task
              (this->m_pTask_pool,SelectorNode::sort_task,uVar9,
               (void *)((long)&(nodes.m_p)->p + lVar15));
    lVar15 = lVar15 + 0x10;
  }
  task_pool::join(this->m_pTask_pool);
  queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar15 = 0;
  for (uVar9 = 0; uVar9 < (nodes._8_8_ & 0xffffffff); uVar9 = uVar9 + 1) {
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::push(&queue,(value_type *)((long)&(nodes.m_p)->p + lVar15));
    lVar15 = lVar15 + 0x10;
  }
  for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
    v[lVar15] = (float)(int)lVar15 * 0.125 + 0.0625;
  }
  vectors.m_p = (vec<16U,_float> *)0x0;
  vectors.m_size = 0;
  vectors.m_capacity = 0;
  weights.m_p = (uint *)0x0;
  weights.m_size = 0;
  weights.m_capacity = 0;
  vector<crnlib::vec<16U,_float>_>::reserve(&vectors,selectors.m_size);
  vector<unsigned_int>::reserve(&weights,selectors.m_size);
  uVar9 = 0;
  while (queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
         _M_impl.super__Vector_impl_data._M_start) {
    selector_details._8_8_ =
         (queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
          _M_impl.super__Vector_impl_data._M_start)->pEnd;
    selector_details.m_p =
         (vector<crnlib::alpha_selector_details> *)
         ((queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
           _M_impl.super__Vector_impl_data._M_start)->p + 1);
    uVar17 = *(queue.c.
               super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
               _M_impl.super__Vector_impl_data._M_start)->p;
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::pop(&queue);
    if (selector_details.m_p != (vector<crnlib::alpha_selector_details> *)selector_details._8_8_) {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push(&queue,(value_type *)&selector_details);
    }
    weight = (uint)uVar17 & 0xffff;
    uVar17 = uVar17 >> 0x10;
    if (vectors.m_size == 0 || uVar17 != uVar9) {
      uVar9 = uVar17;
      for (lVar15 = 0xf; lVar15 != -1; lVar15 = lVar15 + -1) {
        *(float *)((long)&selector_vq.m_vectors + lVar15 * 4) = v[(uint)uVar9 & 7];
        uVar9 = uVar9 >> 3;
      }
      vector<crnlib::vec<16U,_float>_>::push_back(&vectors,(vec<16U,_float> *)&selector_vq);
      vector<unsigned_int>::push_back(&weights,&weight);
      uVar9 = uVar17;
    }
    else {
      uVar8 = weights.m_size - 1;
      if (CARRY4(weight,weights.m_p[uVar8])) {
        weights.m_p[uVar8] = 0xffffffff;
      }
      else {
        weights.m_p[uVar8] = weight + weights.m_p[uVar8];
      }
    }
  }
  selector_vq.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  selector_vq.m_node_index_map.m_values.m_size = 0;
  selector_vq.m_node_index_map.m_values.m_capacity = 0;
  selector_vq.m_vectorComparison.m_p = (bool *)0x0;
  selector_vq.m_vectorComparison.m_size = 0;
  selector_vq.m_vectorComparison.m_capacity = 0;
  selector_vq.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  selector_vq.m_vectorsInfoRight.m_size = 0;
  selector_vq.m_vectorsInfoRight.m_capacity = 0;
  selector_vq.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  selector_vq.m_vectorsInfoLeft.m_size = 0;
  selector_vq.m_vectorsInfoLeft.m_capacity = 0;
  selector_vq.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  selector_vq.m_vectorsInfo.m_size = 0;
  selector_vq.m_vectorsInfo.m_capacity = 0;
  selector_vq.m_weightedDotProducts.m_p = (double *)0x0;
  selector_vq.m_weightedDotProducts.m_size = 0;
  selector_vq.m_weightedDotProducts.m_capacity = 0;
  selector_vq.m_weightedVectors.m_p = (vec<16U,_float> *)0x0;
  selector_vq.m_weightedVectors.m_size = 0;
  selector_vq.m_weightedVectors.m_capacity = 0;
  selector_vq.m_node_index_map.m_hash_shift = 0x20;
  selector_vq.m_node_index_map.m_num_valid = 0;
  selector_vq.m_node_index_map.m_grow_threshold = 0;
  selector_vq.m_nodes.m_p = (vq_node *)0x0;
  selector_vq.m_nodes.m_size = 0;
  selector_vq.m_nodes.m_capacity = 0;
  selector_vq.m_codebook.m_p = (vec<16U,_float> *)0x0;
  selector_vq.m_codebook.m_size = 0;
  selector_vq.m_codebook.m_capacity = 0;
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            (&selector_vq,vectors.m_p,weights.m_p,vectors.m_size,
             (this->m_params).m_alpha_selector_codebook_size,false,this->m_pTask_pool);
  this_00 = &this->m_alpha_selectors;
  vector<unsigned_long_long>::resize(this_00,selector_vq.m_codebook.m_size,false);
  vector<bool>::resize(&this->m_alpha_selectors_used,selector_vq.m_codebook.m_size,false);
  lVar15 = 0;
  for (uVar9 = 0; uVar9 < (selector_vq.m_codebook._8_8_ & 0xffffffff); uVar9 = uVar9 + 1) {
    pfVar10 = (float *)((long)(selector_vq.m_codebook.m_p)->m_s + lVar15);
    this_00->m_p[uVar9] = 0;
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 3) {
      uVar17 = (ulong)(*pfVar10 * 8.0);
      this_00->m_p[uVar9] =
           this_00->m_p[uVar9] |
           ((long)(*pfVar10 * 8.0 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17) <<
           ((byte)lVar7 & 0x3f);
      pfVar10 = pfVar10 + 1;
    }
    lVar15 = lVar15 + 0x40;
  }
  vector<crnlib::vector<crnlib::alpha_selector_details>_>::vector(&selector_details,uVar6);
  lVar15 = 0;
  for (pvVar18 = (void *)0x0; (void *)(ulong)uVar6 != pvVar18; pvVar18 = (void *)((long)pvVar18 + 1)
      ) {
    vector<crnlib::alpha_selector_details>::resize
              ((vector<crnlib::alpha_selector_details> *)
               ((long)&(selector_details.m_p)->m_p + lVar15),(this->m_alpha_selectors).m_size,false)
    ;
    task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
              (this->m_pTask_pool,this,0x161888,0,pvVar18);
    lVar15 = lVar15 + 0x10;
  }
  task_pool::join(this->m_pTask_pool);
  for (pvVar18 = (void *)0x1; pvVar18 < (void *)(ulong)uVar6; pvVar18 = (void *)((long)pvVar18 + 1))
  {
    lVar15 = 0;
    for (uVar9 = 0; uVar9 < (this->m_alpha_selectors).m_size; uVar9 = uVar9 + 1) {
      lVar7 = lVar15;
      for (lVar12 = 0; lVar11 = lVar7, lVar14 = 8, lVar12 != 0x10; lVar12 = lVar12 + 1) {
        while (lVar14 != 0) {
          piVar1 = (int *)((long)(selector_details.m_p)->m_p->error[0] + lVar11);
          *piVar1 = *piVar1 + *(int *)((long)(selector_details.m_p[(long)pvVar18].m_p)->error[0] +
                                      lVar11);
          lVar11 = lVar11 + 4;
          lVar14 = lVar14 + -1;
        }
        lVar7 = lVar7 + 0x20;
      }
      bVar23 = true;
      if ((selector_details.m_p)->m_p[uVar9].used == false) {
        bVar23 = selector_details.m_p[(long)pvVar18].m_p[uVar9].used;
      }
      (selector_details.m_p)->m_p[uVar9].used = bVar23;
      lVar15 = lVar15 + 0x204;
    }
  }
  lVar15 = 0;
  for (uVar9 = 0; uVar9 < (this->m_alpha_selectors).m_size; uVar9 = uVar9 + 1) {
    (this->m_alpha_selectors_used).m_p[uVar9] = (selector_details.m_p)->m_p[uVar9].used;
    paVar3 = (selector_details.m_p)->m_p;
    this_00->m_p[uVar9] = 0;
    bVar5 = 0;
    for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 0x20) {
      lVar12 = lVar7 + lVar15;
      bVar23 = *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 8) <
               *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 4);
      bVar20 = *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 0x10) <
               *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 0xc);
      bVar21 = *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 0x18) <
               *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 0x14);
      bVar22 = *(uint *)((long)paVar3->error[0] + lVar7 + lVar15 + 0x1c) <
               *(uint *)((long)paVar3->error[0] + lVar7 + lVar15);
      uVar6 = 0;
      if (bVar22) {
        uVar6 = 7;
      }
      lVar11 = 0;
      if (bVar22) {
        lVar11 = 0x1c;
      }
      if (*(uint *)((long)paVar3->error[0] + (ulong)bVar23 * 4 + lVar12 + 4) <
          *(uint *)((long)paVar3->error[0] + lVar11 + lVar12)) {
        uVar6 = (uint)(byte)(bVar23 + 1);
      }
      if (*(uint *)((long)paVar3->error[0] + (ulong)bVar21 * 4 + lVar12 + 0x14) <
          *(uint *)((long)paVar3->error[0] + (ulong)bVar20 * 4 + lVar12 + 0xc)) {
        bVar19 = bVar21 + 5;
      }
      else {
        bVar19 = bVar20 + 3;
      }
      uVar8 = (uint)bVar19;
      if (*(uint *)((long)paVar3->error[0] + (ulong)uVar6 * 4 + lVar12) <=
          *(uint *)((long)paVar3->error[0] + (ulong)(uint)bVar19 * 4 + lVar12)) {
        uVar8 = uVar6;
      }
      this_00->m_p[uVar9] = this_00->m_p[uVar9] | (ulong)uVar8 << (bVar5 & 0x3f);
      bVar5 = bVar5 + 3;
    }
    lVar15 = lVar15 + 0x204;
  }
  vector<crnlib::vector<crnlib::alpha_selector_details>_>::~vector(&selector_details);
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer(&selector_vq);
  vector<unsigned_int>::~vector(&weights);
  vector<crnlib::vec<16U,_float>_>::~vector(&vectors);
  std::_Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>::~_Vector_base
            ((_Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_> *)&queue);
  vector<crnlib::SelectorNode>::~vector(&nodes);
  vector<unsigned_long_long>::~vector(&selectors);
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<uint64> selectors(m_num_alpha_blocks * (m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks));
  for (uint i = 0, c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
    for (uint b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
      selectors[i++] = m_block_selectors[c][b];
  }

  crnlib::vector<SelectorNode> nodes;
  SelectorNode node(0, selectors.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<SelectorNode> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  float v[8];
  for (uint s = 0; s < 8; s++)
    v[s] = (s + 0.5f) * 0.125f;

  crnlib::vector<vec16F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(selectors.size());
  weights.reserve(selectors.size());
  for (uint64 prev_selector = 0; queue.size();) {
    SelectorNode node = queue.top();
    uint64 selector = *node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    uint weight = (uint16)selector;
    selector >>= 16;
    if (!vectors.size() || selector != prev_selector) {
      prev_selector = selector;
      vec16F vector;
      for (uint p = 0; p < 16; p++, selector >>= 3)
        vector[15 - p] = v[selector & 7];
      vectors.push_back(vector);
      weights.push_back(weight);
    } else if (weights.back() > UINT_MAX - weight) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += weight;
    }
  }

  tree_clusterizer<vec16F> selector_vq;
  selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_alpha_selector_codebook_size, false, m_pTask_pool);
  m_alpha_selectors.resize(selector_vq.get_codebook_size());
  m_alpha_selectors_used.resize(selector_vq.get_codebook_size());
  for (uint i = 0; i < selector_vq.get_codebook_size(); i++) {
    const vec16F& v = selector_vq.get_codebook_entry(i);
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, j = 0; j < 16; j++, sh += 3)
      m_alpha_selectors[i] |= (uint64)(v[j] * 8.0f) << sh;
  }

  crnlib::vector<crnlib::vector<alpha_selector_details> > selector_details(num_tasks);
  for (uint t = 0; t < num_tasks; t++) {
    selector_details[t].resize(m_alpha_selectors.size());
    m_pTask_pool->queue_object_task(this, &dxt_hc::create_alpha_selector_codebook_task, t, &selector_details[t]);
  }
  m_pTask_pool->join();

  for (uint t = 1; t < num_tasks; t++) {
    for (uint i = 0; i < m_alpha_selectors.size(); i++) {
      for (uint8 p = 0; p < 16; p++) {
        for (uint8 s = 0; s < 8; s++)
          selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
      }
      selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
    }
  }

  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    m_alpha_selectors_used[i] = selector_details[0][i].used;
    uint (&errors)[16][8] = selector_details[0][i].error;
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, p = 0; p < 16; p++, sh += 3) {
      uint* e = errors[p];
      uint8 s07 = e[7] < e[0] ? 7 : 0;
      uint8 s12 = e[2] < e[1] ? 2 : 1;
      uint8 s34 = e[4] < e[3] ? 4 : 3;
      uint8 s56 = e[6] < e[5] ? 6 : 5;
      uint8 s02 = e[s12] < e[s07] ? s12 : s07;
      uint8 s36 = e[s56] < e[s34] ? s56 : s34;
      m_alpha_selectors[i] |= (uint64)(e[s36] < e[s02] ? s36 : s02) << sh;
    }
  }
}